

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_main.cpp
# Opt level: O3

void swrenderer::R_SetupColormap(player_t *player)

{
  short sVar1;
  BYTE **ppBVar2;
  
  realfixedcolormap = (FSpecialColormap *)0x0;
  fixedcolormap = (BYTE *)0x0;
  fixedlightlev = -1;
  if ((player != (player_t *)0x0) && ((APlayerPawn *)camera == player->mo)) {
    sVar1 = player->fixedcolormap;
    if ((sVar1 < 0) || ((int)SpecialColormaps.Count <= (int)sVar1)) {
      if (0x1f < (ushort)player->fixedlightlevel) {
        fixedlightlev = 0xffffffff;
        fixedcolormap = (BYTE *)0x0;
        realfixedcolormap = (FSpecialColormap *)0x0;
        return;
      }
      fixedlightlev = (uint)(ushort)player->fixedlightlevel << 8;
      if (!r_fullbrightignoresectorcolor.Value) {
        fixedcolormap = (BYTE *)0x0;
        realfixedcolormap = (FSpecialColormap *)0x0;
        return;
      }
      ppBVar2 = &FullNormalLight.Maps;
    }
    else {
      realfixedcolormap = SpecialColormaps.Array + (int)sVar1;
      if ((((DFrameBuffer *)RenderTarget != screen) || (screen->Accel2D == false)) ||
         (!r_shadercolormaps.Value)) {
        fixedcolormap = realfixedcolormap->Colormap;
        return;
      }
      ppBVar2 = &realcolormaps;
    }
    fixedcolormap = ((FDynamicColormap *)ppBVar2)->Maps;
  }
  return;
}

Assistant:

void R_SetupColormap(player_t *player)
{
	realfixedcolormap = NULL;
	fixedcolormap = NULL;
	fixedlightlev = -1;

	if (player != NULL && camera == player->mo)
	{
		if (player->fixedcolormap >= 0 && player->fixedcolormap < (int)SpecialColormaps.Size())
		{
			realfixedcolormap = &SpecialColormaps[player->fixedcolormap];
			if (RenderTarget == screen && (DFrameBuffer *)screen->Accel2D && r_shadercolormaps)
			{
				// Render everything fullbright. The copy to video memory will
				// apply the special colormap, so it won't be restricted to the
				// palette.
				fixedcolormap = realcolormaps;
			}
			else
			{
				fixedcolormap = SpecialColormaps[player->fixedcolormap].Colormap;
			}
		}
		else if (player->fixedlightlevel >= 0 && player->fixedlightlevel < NUMCOLORMAPS)
		{
			fixedlightlev = player->fixedlightlevel * 256;
			// [SP] Emulate GZDoom's light-amp goggles.
			if (r_fullbrightignoresectorcolor && fixedlightlev >= 0)
			{
				fixedcolormap = FullNormalLight.Maps;
			}
		}
	}
	// [RH] Inverse light for shooting the Sigil
	if (fixedcolormap == NULL && extralight == INT_MIN)
	{
		fixedcolormap = SpecialColormaps[INVERSECOLORMAP].Colormap;
		extralight = 0;
	}
}